

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  Descriptor *pDVar2;
  FileDescriptor *descriptor_00;
  string local_70;
  string local_50;
  Context *local_20;
  Context *context_local;
  FieldDescriptor *descriptor_local;
  ImmutableExtensionLiteGenerator *this_local;
  
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  ExtensionGenerator::ExtensionGenerator(&this->super_ExtensionGenerator);
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionLiteGenerator_00efc078;
  this->descriptor_ = (FieldDescriptor *)context_local;
  pCVar1 = Context::GetNameResolver(local_20);
  this->name_resolver_ = pCVar1;
  std::__cxx11::string::string((string *)&this->scope_);
  this->context_ = local_20;
  pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar2 == (Descriptor *)0x0) {
    pCVar1 = this->name_resolver_;
    descriptor_00 = FieldDescriptor::file(this->descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_70,pCVar1,descriptor_00);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    pCVar1 = this->name_resolver_;
    pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>(&local_50,pCVar1,pDVar2);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(
    const FieldDescriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      name_resolver_(context->GetNameResolver()),
      context_(context) {
  if (descriptor_->extension_scope() != nullptr) {
    scope_ =
        name_resolver_->GetImmutableClassName(descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}